

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O2

void pair_lookup_fill_distance(pair_lookup_t pairs,distance_t *distances)

{
  ulong uVar1;
  
  for (uVar1 = 1; uVar1 < pairs.outputs_len; uVar1 = (ulong)((int)uVar1 + 1)) {
    pairs.distances[uVar1] =
         CONCAT22(distances[pairs.outputs[uVar1] >> ((byte)pairs.output_width & 0x1f)],
                  distances[pairs.output_mask & pairs.outputs[uVar1]]);
  }
  return;
}

Assistant:

void pair_lookup_fill_distance(pair_lookup_t pairs, distance_t *distances) {
    for (unsigned int i = 1; i < pairs.outputs_len; i += 1) {
        output_pair_t concat_out = pairs.outputs[i];
        unsigned int i_0 = concat_out & pairs.output_mask;
        concat_out >>= pairs.output_width;
        unsigned int i_1 = concat_out;

        pairs.distances[i] = (distances[i_1] << 16) | distances[i_0];
    }
}